

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_lscbx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 EA;
  TCGv_i32 arg3;
  TCGv_i32 arg4;
  TCGv_i32 arg5;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  EA = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = rD(ctx->opcode);
  arg3 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
  uVar1 = rA(ctx->opcode);
  arg4 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
  uVar1 = rB(ctx->opcode);
  arg5 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
  gen_addr_reg_index(ctx,EA);
  gen_helper_lscbx(tcg_ctx_00,EA,tcg_ctx_00->cpu_env,EA,arg3,arg4,arg5);
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  tcg_temp_free_i32(tcg_ctx_00,arg4);
  tcg_temp_free_i32(tcg_ctx_00,arg5);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,cpu_xer,cpu_xer,-0x80);
  tcg_gen_or_i64_ppc64(tcg_ctx_00,cpu_xer,cpu_xer,EA);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    gen_set_Rc0(ctx,EA);
  }
  tcg_temp_free_i64(tcg_ctx_00,EA);
  return;
}

Assistant:

static void gen_lscbx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv_i32 t1 = tcg_const_i32(tcg_ctx, rD(ctx->opcode));
    TCGv_i32 t2 = tcg_const_i32(tcg_ctx, rA(ctx->opcode));
    TCGv_i32 t3 = tcg_const_i32(tcg_ctx, rB(ctx->opcode));

    gen_addr_reg_index(ctx, t0);
    gen_helper_lscbx(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1, t2, t3);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_gen_andi_tl(tcg_ctx, cpu_xer, cpu_xer, ~0x7F);
    tcg_gen_or_tl(tcg_ctx, cpu_xer, cpu_xer, t0);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t0);
    }
    tcg_temp_free(tcg_ctx, t0);
}